

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3423::ComputeInternalJacobians
          (ChElementShellANCF_3423 *this,double Kfactor,double Rfactor)

{
  pointer pdVar1;
  long lVar2;
  ulong uVar3;
  ShellANCF_Jacobian formula;
  ChMatrixNM<double,_5,_5> KalphaEAS_inv;
  ChMatrixNM<double,_5,_24> GDEPSP;
  ChVectorN<double,_696> result;
  ChMatrixNM<double,_24,_24> KTE;
  double local_2d98;
  MatrixBase<Eigen::Matrix<double,24,24,1,24,24>> *local_2d90;
  _func_int **local_2d88;
  double local_2d80;
  ulong local_2d78;
  long local_2d70;
  Matrix<double,_5,_24,_1,_5,_24> *local_2d68;
  ChIntegrable3D<Eigen::Matrix<double,_696,_1,_0,_696,_1>_> local_2d60;
  ChElementShellANCF_3423 *local_2d58;
  double local_2d50;
  double local_2d48;
  ulong local_2d40;
  Matrix<double,_24,_24,_1,_24,_24> *local_2d38 [3];
  double local_2d20;
  non_const_type local_2d18;
  Matrix<double,_5,_5,_1,_5,_5> *local_2d08;
  Matrix<double,_5,_24,_1,_5,_24> *local_2d00;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_5,_0,_24,_5>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>_>
  local_2cf0;
  Matrix<double,_5,_5,_1,_5,_5> local_2cc8;
  Matrix<double,_5,_24,_1,_5,_24> local_2c00;
  Matrix<double,_696,_1,_0,_696,_1> local_2840;
  Matrix<double,_24,_24,_1,_24,_24> local_1280;
  
  local_2d90 = (MatrixBase<Eigen::Matrix<double,24,24,1,24,24>> *)&this->m_JacobianMatrix;
  local_2d98 = Kfactor;
  local_2d80 = Rfactor;
  Eigen::DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *)local_2d90);
  local_2d70 = 0;
  local_2d88 = (_func_int **)&PTR__ChIntegrable3D_011836c0;
  uVar3 = 0;
  while (uVar3 < this->m_numLayers) {
    local_2d60._vptr_ChIntegrable3D = local_2d88;
    local_2d50 = local_2d98;
    local_2d48 = local_2d80;
    local_2d58 = this;
    local_2d40 = uVar3;
    Eigen::DenseBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_> *)&local_2840);
    pdVar1 = (this->m_GaussZ).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_2d78 = uVar3;
    ChQuadrature::Integrate3D<Eigen::Matrix<double,696,1,0,696,1>>
              (&local_2840,&local_2d60,-1.0,1.0,-1.0,1.0,pdVar1[uVar3],pdVar1[uVar3 + 1],2);
    Eigen::VectorBlock<Eigen::Matrix<double,_696,_1,_0,_696,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_696,_1,_0,_696,_1>,__1> *)&local_2cc8,&local_2840,
               0,0x240);
    Eigen::MapBase<Eigen::Map<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_0,_Eigen::Stride<0,_0>_>,_0>
    ::MapBase((MapBase<Eigen::Map<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_0,_Eigen::Stride<0,_0>_>,_0>
               *)local_2d38,
              (PointerType)
              local_2cc8.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.m_storage.
              m_data.array[0],0x18,0x18);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,24,24,1,24,24>,Eigen::Map<Eigen::Matrix<double,24,24,1,24,24>,0,Eigen::Stride<0,0>>>
              (&local_1280,
               (Map<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_0,_Eigen::Stride<0,_0>_> *)local_2d38)
    ;
    Eigen::VectorBlock<Eigen::Matrix<double,_696,_1,_0,_696,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_696,_1,_0,_696,_1>,__1> *)&local_2cc8,&local_2840,
               0x240,0x78);
    lVar2 = local_2d70;
    Eigen::MapBase<Eigen::Map<Eigen::Matrix<double,_5,_24,_1,_5,_24>,_0,_Eigen::Stride<0,_0>_>,_0>::
    MapBase((MapBase<Eigen::Map<Eigen::Matrix<double,_5,_24,_1,_5,_24>,_0,_Eigen::Stride<0,_0>_>,_0>
             *)local_2d38,
            (PointerType)
            local_2cc8.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.m_storage.m_data
            .array[0],5,0x18);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,5,24,1,5,24>,Eigen::Map<Eigen::Matrix<double,5,24,1,5,24>,0,Eigen::Stride<0,0>>>
              (&local_2c00,
               (Map<Eigen::Matrix<double,_5,_24,_1,_5,_24>,_0,_Eigen::Stride<0,_0>_> *)local_2d38);
    Eigen::internal::
    compute_inverse<Eigen::Matrix<double,_5,_5,_1,_5,_5>,_Eigen::Matrix<double,_5,_5,_1,_5,_5>,_5>::
    run((Matrix<double,_5,_5,_1,_5,_5> *)
        ((long)&(((this->m_KalphaEAS).
                  super__Vector_base<Eigen::Matrix<double,_5,_5,_1,_5,_5>,_std::allocator<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.m_data +
        lVar2),&local_2cc8);
    local_2d68 = &local_2c00;
    Eigen::operator*(&local_2cf0,&local_2d98,(StorageBaseType *)&local_2d68);
    local_2d38[0] = &local_1280;
    local_2d20 = local_2cf0.m_lhs.m_functor.m_other;
    local_2d18 = local_2cf0.m_rhs.m_matrix;
    local_2d08 = &local_2cc8;
    local_2d00 = &local_2c00;
    Eigen::MatrixBase<Eigen::Matrix<double,24,24,1,24,24>>::operator+=
              (local_2d90,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_5,_0,_24,_5>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>_>,_Eigen::Matrix<double,_5,_5,_1,_5,_5>,_0>,_Eigen::Matrix<double,_5,_24,_1,_5,_24>,_0>_>_>
                *)local_2d38);
    local_2d70 = lVar2 + 200;
    uVar3 = local_2d78 + 1;
  }
  return;
}

Assistant:

void ChElementShellANCF_3423::ComputeInternalJacobians(double Kfactor, double Rfactor) {
    // Note that the matrices with current nodal coordinates and velocities are
    // already available in m_d and m_d_dt (as set in ComputeInternalForces).
    // Similarly, the ANS strain and strain derivatives are already available in
    // m_strainANS and m_strainANS_D (as calculated in ComputeInternalForces).

    m_JacobianMatrix.setZero();

    // Loop over all layers.
    for (size_t kl = 0; kl < m_numLayers; kl++) {
        ShellANCF_Jacobian formula(this, Kfactor, Rfactor, kl);
        ChVectorN<double, 696> result;
        result.setZero();
        ChQuadrature::Integrate3D<ChVectorN<double, 696>>(result,                          // result of integration
                                                          formula,                         // integrand formula
                                                          -1, 1,                           // x limits
                                                          -1, 1,                           // y limits
                                                          m_GaussZ[kl], m_GaussZ[kl + 1],  // z limits
                                                          2                                // order of integration
        );

        // Extract matrices from result of integration
        ChMatrixNM<double, 24, 24> KTE;
        ChMatrixNM<double, 5, 24> GDEPSP;
        KTE = Eigen::Map<ChMatrixNM<double, 24, 24>>(result.segment(0, 24 * 24).data(), 24, 24);
        GDEPSP = Eigen::Map<ChMatrixNM<double, 5, 24>>(result.segment(576, 5 * 24).data(), 5, 24);

        // Include EAS contribution to the stiffness component (hence scaled by Kfactor)
        // EAS = GDEPSP' * KalphaEAS_inv * GDEPSP
        ChMatrixNM<double, 5, 5> KalphaEAS_inv = m_KalphaEAS[kl].inverse();
        m_JacobianMatrix += KTE - Kfactor * GDEPSP.transpose() * KalphaEAS_inv * GDEPSP;
    }
}